

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O1

void use_bell(obj **optr)

{
  obj *obj;
  bool bVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  permonst *ptr;
  monst *mtmp;
  bool bVar6;
  bool bVar7;
  coord mm;
  coord local_2a;
  
  obj = *optr;
  bVar6 = true;
  if (obj->otyp == 0x10c) {
    bVar6 = obj->spe == '\0';
    bVar2 = invocation_pos(&u.uz,u.ux,u.uy);
    if (bVar2 == '\0') goto LAB_0014753a;
    bVar2 = On_stairs(u.ux,u.uy);
    bVar7 = bVar2 == '\0';
  }
  else {
LAB_0014753a:
    bVar7 = false;
  }
  pcVar5 = xname(obj);
  pcVar5 = the(pcVar5);
  pline("You ring %s.",pcVar5);
  if (((u._1052_1_ & 2) == 0) && ((u._1052_1_ & bVar6) == 0)) {
    if ((bVar7 & bVar6) == 1) {
      pcVar5 = "But it makes no sound.";
      goto LAB_001475d0;
    }
    if (bVar6 != false) {
      bVar7 = true;
      bVar6 = true;
      if (((((obj->field_0x4a & 1) != 0) && (uVar3 = mt_random(), (uVar3 & 3) == 0)) &&
          ((mvitals[0x44].mvflags & 3) == 0)) &&
         (((mvitals[0x45].mvflags & 3) == 0 && ((mvitals[0x46].mvflags & 3) == 0)))) {
        bVar1 = false;
        ptr = mkclass(&u.uz,'\x0e',0);
        mtmp = makemon(ptr,level,(int)u.ux,(int)u.uy,1);
        if (mtmp == (monst *)0x0) goto LAB_0014758b;
        pcVar5 = a_monnam(mtmp);
        pline("You summon %s!",pcVar5);
        bVar2 = obj_resists(obj,0x5d,100);
        if (bVar2 == '\0') {
          pcVar5 = Tobjnam(obj,"have");
          bVar1 = false;
          pline("%s shattered!",pcVar5);
          useup(obj);
          *optr = (obj *)0x0;
          goto LAB_0014758b;
        }
        uVar3 = mt_random();
        if (uVar3 % 3 == 2) {
          nomovemsg = "";
          uVar3 = mt_random();
          bVar1 = false;
          nomul(~uVar3 | 0xfffffffe,(char *)0x0);
          goto LAB_0014758b;
        }
        if (uVar3 % 3 == 1) {
          bVar1 = false;
          mon_adjust_speed(mtmp,2,(obj *)0x0);
          goto LAB_0014758b;
        }
      }
LAB_0014772e:
      bVar6 = bVar7;
      bVar1 = false;
      goto LAB_0014758b;
    }
    consume_obj_charge(obj,'\x01');
    uVar3 = *(uint *)&obj->field_0x4a;
    if ((u._1052_1_ & 1) != 0) {
      if ((uVar3 & 1) != 0) goto LAB_001477b3;
      openit();
      goto LAB_00147585;
    }
    if ((uVar3 & 1) != 0) {
      local_2a.x = u.ux;
      local_2a.y = u.uy;
      bVar1 = false;
      mkundead(level,&local_2a,'\0',1);
      bVar6 = true;
      goto LAB_0014758b;
    }
    if (bVar7 != false) {
      pcVar5 = Tobjnam(obj,"issue");
      pline("%s an unsettling shrill sound...",pcVar5);
      obj->age = moves;
      bVar7 = false;
      goto LAB_0014772e;
    }
    if ((uVar3 & 2) == 0) {
      iVar4 = findit();
      if (iVar4 != 0) {
        bVar1 = true;
        bVar6 = false;
        goto LAB_0014758b;
      }
LAB_001477b3:
      pcVar5 = "Nothing happens.";
      goto LAB_0014757e;
    }
    bVar6 = uchain != (obj *)0x0;
    if (bVar6) {
      unpunish();
    }
    iVar4 = openit();
    iVar4 = iVar4 + (uint)bVar6;
    if (iVar4 == 1) {
      pcVar5 = "Something opens...";
    }
    else {
      if (iVar4 == 0) goto LAB_001477b3;
      pcVar5 = "Things open around you...";
    }
LAB_001475d0:
    bVar6 = false;
    pline(pcVar5);
  }
  else {
    pcVar5 = "But the sound is muffled.";
LAB_0014757e:
    pline(pcVar5);
LAB_00147585:
    bVar6 = true;
  }
  bVar1 = true;
LAB_0014758b:
  if (!bVar6) {
    discover_object(0x10c,'\x01','\x01');
    obj->field_0x4a = obj->field_0x4a | 0x10;
  }
  if (!bVar1) {
    wake_nearby();
  }
  return;
}

Assistant:

static void use_bell(struct obj **optr)
{
	struct obj *obj = *optr;
	struct monst *mtmp;
	boolean wakem = FALSE, learno = FALSE,
		ordinary = (obj->otyp != BELL_OF_OPENING || !obj->spe),
		invoking = (obj->otyp == BELL_OF_OPENING &&
			 invocation_pos(&u.uz, u.ux, u.uy) && !On_stairs(u.ux, u.uy));

	pline("You ring %s.", the(xname(obj)));

	if (Underwater || (u.uswallow && ordinary)) {
	    pline("But the sound is muffled.");

	} else if (invoking && ordinary) {
	    /* needs to be recharged... */
	    pline("But it makes no sound.");
	    learno = TRUE;	/* help player figure out why */

	} else if (ordinary) {
	    if (obj->cursed && !rn2(4) &&
		    /* note: once any of them are gone, we stop all of them */
		    !(mvitals[PM_WOOD_NYMPH].mvflags & G_GONE) &&
		    !(mvitals[PM_WATER_NYMPH].mvflags & G_GONE) &&
		    !(mvitals[PM_MOUNTAIN_NYMPH].mvflags & G_GONE) &&
		    (mtmp = makemon(mkclass(&u.uz, S_NYMPH, 0), level,
					u.ux, u.uy, NO_MINVENT)) != 0) {
		pline("You summon %s!", a_monnam(mtmp));
		if (!obj_resists(obj, 93, 100)) {
		    pline("%s shattered!", Tobjnam(obj, "have"));
		    useup(obj);
		    *optr = 0;
		} else switch (rn2(3)) {
			default:
				break;
			case 1:
				mon_adjust_speed(mtmp, 2, NULL);
				break;
			case 2: /* no explanation; it just happens... */
				nomovemsg = "";
				nomul(-rnd(2), NULL);
				break;
		}
	    }
	    wakem = TRUE;

	} else {
	    /* charged Bell of Opening */
	    consume_obj_charge(obj, TRUE);

	    if (u.uswallow) {
		if (!obj->cursed)
		    openit();
		else
		    pline("Nothing happens.");

	    } else if (obj->cursed) {
		coord mm;

		mm.x = u.ux;
		mm.y = u.uy;
		mkundead(level, &mm, FALSE, NO_MINVENT);
		wakem = TRUE;

	    } else  if (invoking) {
		pline("%s an unsettling shrill sound...",
		      Tobjnam(obj, "issue"));
		obj->age = moves;
		learno = TRUE;
		wakem = TRUE;

	    } else if (obj->blessed) {
		int res = 0;

		if (uchain) {
		    unpunish();
		    res = 1;
		}
		res += openit();
		switch (res) {
		  case 0:  pline("Nothing happens."); break;
		  case 1:  pline("Something opens...");
			   learno = TRUE; break;
		  default: pline("Things open around you...");
			   learno = TRUE; break;
		}

	    } else {  /* uncursed */
		if (findit() != 0) learno = TRUE;
		else pline("Nothing happens.");
	    }

	}	/* charged BofO */

	if (learno) {
	    makeknown(BELL_OF_OPENING);
	    obj->known = 1;
	}
	if (wakem) wake_nearby();
}